

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

void __thiscall
Diligent::DearchiverBase::PSOData<Diligent::GraphicsPipelineStateCreateInfo>::AssignShaders
          (PSOData<Diligent::GraphicsPipelineStateCreateInfo> *this)

{
  pointer pRVar1;
  int iVar2;
  undefined4 extraout_var;
  SHADER_TYPE ExpectedType;
  IShader *pSrcShader;
  IShader **pDstShader;
  pointer pRVar3;
  string _msg;
  
  pRVar3 = (this->Shaders).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->Shaders).
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pRVar3 == pRVar1) {
      return;
    }
    iVar2 = (*(pRVar3->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 8);
    switch(iVar2) {
    case 1:
      pSrcShader = pRVar3->m_pObject;
      ExpectedType = SHADER_TYPE_VERTEX;
      pDstShader = &(this->CreateInfo).pVS;
      break;
    case 2:
      pSrcShader = pRVar3->m_pObject;
      ExpectedType = SHADER_TYPE_PIXEL;
      pDstShader = &(this->CreateInfo).pPS;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_003deadc_caseD_3:
      FormatString<char[46]>(&_msg,(char (*) [46])"Unsupported shader type for graphics pipeline");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&_msg);
      return;
    case 4:
      pSrcShader = pRVar3->m_pObject;
      ExpectedType = SHADER_TYPE_GEOMETRY;
      pDstShader = &(this->CreateInfo).pGS;
      break;
    case 8:
      pSrcShader = pRVar3->m_pObject;
      ExpectedType = SHADER_TYPE_HULL;
      pDstShader = &(this->CreateInfo).pHS;
      break;
    default:
      if (iVar2 == 0x10) {
        pSrcShader = pRVar3->m_pObject;
        ExpectedType = SHADER_TYPE_DOMAIN;
        pDstShader = &(this->CreateInfo).pDS;
      }
      else if (iVar2 == 0x40) {
        pSrcShader = pRVar3->m_pObject;
        ExpectedType = SHADER_TYPE_AMPLIFICATION;
        pDstShader = &(this->CreateInfo).pAS;
      }
      else {
        if (iVar2 != 0x80) goto switchD_003deadc_caseD_3;
        pSrcShader = pRVar3->m_pObject;
        ExpectedType = SHADER_TYPE_MESH;
        pDstShader = &(this->CreateInfo).pMS;
      }
    }
    AssignShader(pDstShader,pSrcShader,ExpectedType);
    pRVar3 = pRVar3 + 1;
  } while( true );
}

Assistant:

void DearchiverBase::PSOData<GraphicsPipelineStateCreateInfo>::AssignShaders()
{
    for (RefCntAutoPtr<IShader>& Shader : Shaders)
    {
        const SHADER_TYPE ShaderType = Shader->GetDesc().ShaderType;
        switch (ShaderType)
        {
            // clang-format off
            case SHADER_TYPE_VERTEX:        AssignShader(CreateInfo.pVS, Shader, ShaderType); break;
            case SHADER_TYPE_PIXEL:         AssignShader(CreateInfo.pPS, Shader, ShaderType); break;
            case SHADER_TYPE_GEOMETRY:      AssignShader(CreateInfo.pGS, Shader, ShaderType); break;
            case SHADER_TYPE_HULL:          AssignShader(CreateInfo.pHS, Shader, ShaderType); break; 
            case SHADER_TYPE_DOMAIN:        AssignShader(CreateInfo.pDS, Shader, ShaderType); break;
            case SHADER_TYPE_AMPLIFICATION: AssignShader(CreateInfo.pAS, Shader, ShaderType); break;
            case SHADER_TYPE_MESH:          AssignShader(CreateInfo.pMS, Shader, ShaderType); break;
            // clang-format on
            default:
                LOG_ERROR_MESSAGE("Unsupported shader type for graphics pipeline");
                return;
        }
    }
}